

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_color_f(float *r,float *g,float *b,float *a,nk_color in)

{
  float *a_local;
  float *b_local;
  float *g_local;
  float *r_local;
  nk_color in_local;
  
  *r = (float)((uint)in & 0xff) * 0.003921569;
  *g = (float)((uint)in >> 8 & 0xff) * 0.003921569;
  *b = (float)((uint)in >> 0x10 & 0xff) * 0.003921569;
  *a = (float)((uint)in >> 0x18) * 0.003921569;
  return;
}

Assistant:

NK_API void
nk_color_f(float *r, float *g, float *b, float *a, struct nk_color in)
{
    NK_STORAGE const float s = 1.0f/255.0f;
    *r = (float)in.r * s;
    *g = (float)in.g * s;
    *b = (float)in.b * s;
    *a = (float)in.a * s;
}